

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-ft-stroker.c
# Opt level: O2

PVG_FT_Error
ft_stroke_border_get_counts
          (PVG_FT_StrokeBorder border,PVG_FT_UInt *anum_points,PVG_FT_UInt *anum_contours)

{
  byte bVar1;
  PVG_FT_UInt PVar2;
  PVG_FT_UInt PVar3;
  long lVar4;
  bool bVar5;
  
  PVar2 = border->num_points;
  PVar3 = 0;
  bVar5 = false;
  for (lVar4 = 0; PVar2 != (PVG_FT_UInt)lVar4; lVar4 = lVar4 + 1) {
    bVar1 = border->tags[lVar4];
    if (((bVar1 & 4) == 0) == !bVar5) goto LAB_00136866;
    bVar5 = (bVar1 & 8) == 0;
    PVar3 = PVar3 + ((bVar1 & 8) >> 3);
  }
  if (bVar5) {
LAB_00136866:
    PVar2 = 0;
    PVar3 = 0;
  }
  else {
    border->valid = '\x01';
  }
  *anum_points = PVar2;
  *anum_contours = PVar3;
  return PVar2;
}

Assistant:

static PVG_FT_Error ft_stroke_border_get_counts(PVG_FT_StrokeBorder border,
                                               PVG_FT_UInt*        anum_points,
                                               PVG_FT_UInt*        anum_contours)
{
    PVG_FT_Error error = 0;
    PVG_FT_UInt  num_points = 0;
    PVG_FT_UInt  num_contours = 0;

    PVG_FT_UInt    count = border->num_points;
    PVG_FT_Vector* point = border->points;
    PVG_FT_Byte*   tags = border->tags;
    PVG_FT_Int     in_contour = 0;

    for (; count > 0; count--, num_points++, point++, tags++) {
        if (tags[0] & PVG_FT_STROKE_TAG_BEGIN) {
            if (in_contour != 0) goto Fail;

            in_contour = 1;
        } else if (in_contour == 0)
            goto Fail;

        if (tags[0] & PVG_FT_STROKE_TAG_END) {
            in_contour = 0;
            num_contours++;
        }
    }

    if (in_contour != 0) goto Fail;

    border->valid = TRUE;

Exit:
    *anum_points = num_points;
    *anum_contours = num_contours;
    return error;

Fail:
    num_points = 0;
    num_contours = 0;
    goto Exit;
}